

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_commodities.cpp
# Opt level: O0

void __thiscall commodities_unusual2string_Test::TestBody(commodities_unusual2string_Test *this)

{
  bool bVar1;
  uint32_t uVar2;
  precise_unit *ppVar3;
  uint64_t uVar4;
  char *pcVar5;
  precise_unit *ppVar6;
  uint64_t in_RCX;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double in_XMM1_Qa;
  precise_unit pVar7;
  AssertHelper local_2f0;
  Message local_2e8;
  string local_2e0;
  precise_unit local_2c0;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_3;
  allocator local_269;
  string local_268;
  precise_unit local_248;
  precise_unit local_238;
  undefined1 auStack_228 [8];
  precise_unit com2inv;
  AssertHelper local_210;
  Message local_208;
  string local_200;
  precise_unit local_1e0;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_2;
  undefined1 local_1a0 [8];
  precise_unit cominv;
  Message local_188;
  string local_180;
  precise_unit local_160;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_1;
  allocator local_119;
  string local_118;
  precise_unit local_f8;
  undefined1 local_e8 [8];
  precise_unit com2;
  Message local_d0;
  string local_c8;
  precise_unit local_a8;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  string str;
  allocator local_51;
  string local_50;
  precise_unit local_30;
  undefined1 local_20 [8];
  precise_unit com;
  commodities_unusual2string_Test *this_local;
  
  com._8_8_ = this;
  pVar7 = units::precise_unit::inv((precise_unit *)units::precise::kg);
  local_30._8_8_ = pVar7._8_8_;
  local_30.multiplier_ = pVar7.multiplier_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"happy\'u",&local_51);
  uVar2 = units::getCommodity(&local_50);
  units::precise_unit::precise_unit((precise_unit *)local_20,1.0,&local_30,uVar2);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_((string *)&gtest_ar.message_,(units *)local_20,ppVar3,in_RCX);
  std::__cxx11::string::string((string *)&local_c8,(string *)&gtest_ar.message_);
  uVar4 = units::getDefaultFlags();
  pVar7 = units::unit_from_string(&local_c8,uVar4);
  local_a8._8_8_ = pVar7._8_8_;
  local_a8.multiplier_ = pVar7.multiplier_;
  ppVar3 = &local_a8;
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_98,"unit_from_string(str)","com",ppVar3,(precise_unit *)local_20);
  std::__cxx11::string::~string((string *)&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    ppVar3 = (precise_unit *)0xa3;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&com2.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_commodities.cpp"
               ,0xa3,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&com2.base_units_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&com2.base_units_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_f8.multiplier_ =
       units::precise_unit::pow
                 ((precise_unit *)units::precise::kg,
                  (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),in_XMM1_Qa);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"happy\'u",&local_119);
  uVar2 = units::getCommodity(&local_118);
  units::precise_unit::precise_unit((precise_unit *)local_e8,12.0,&local_f8,uVar2);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  ppVar6 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_
            ((string *)&gtest_ar_1.message_,(units *)local_e8,ppVar6,(uint64_t)ppVar3);
  std::__cxx11::string::operator=((string *)&gtest_ar.message_,(string *)&gtest_ar_1.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
  std::__cxx11::string::string((string *)&local_180,(string *)&gtest_ar.message_);
  uVar4 = units::getDefaultFlags();
  pVar7 = units::unit_from_string(&local_180,uVar4);
  local_160._8_8_ = pVar7._8_8_;
  local_160.multiplier_ = pVar7.multiplier_;
  ppVar3 = &local_160;
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_150,"unit_from_string(str)","com2",ppVar3,(precise_unit *)local_e8);
  std::__cxx11::string::~string((string *)&local_180);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    ppVar3 = (precise_unit *)0xa7;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cominv.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_commodities.cpp"
               ,0xa7,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cominv.base_units_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cominv.base_units_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  pVar7 = units::precise_unit::inv((precise_unit *)local_20);
  cominv.multiplier_ = pVar7._8_8_;
  local_1a0 = (undefined1  [8])pVar7.multiplier_;
  ppVar6 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_
            ((string *)&gtest_ar_2.message_,(units *)local_1a0,ppVar6,(uint64_t)ppVar3);
  std::__cxx11::string::operator=((string *)&gtest_ar.message_,(string *)&gtest_ar_2.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
  std::__cxx11::string::string((string *)&local_200,(string *)&gtest_ar.message_);
  uVar4 = units::getDefaultFlags();
  pVar7 = units::unit_from_string(&local_200,uVar4);
  local_1e0._8_8_ = pVar7._8_8_;
  local_1e0.multiplier_ = pVar7.multiplier_;
  ppVar3 = &local_1e0;
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_1d0,"unit_from_string(str)","cominv",ppVar3,(precise_unit *)local_1a0
            );
  std::__cxx11::string::~string((string *)&local_200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    ppVar3 = (precise_unit *)0xab;
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_commodities.cpp"
               ,0xab,pcVar5);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  local_248.multiplier_ =
       units::precise_unit::pow
                 ((precise_unit *)units::precise::m,
                  (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00),in_XMM1_Qa);
  pVar7 = units::precise_unit::operator*(&local_248,(precise_unit *)units::precise::kg);
  local_238._8_8_ = pVar7._8_8_;
  local_238.multiplier_ = pVar7.multiplier_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_268,"happy\'u",&local_269);
  uVar2 = units::getCommodity(&local_268);
  units::precise_unit::precise_unit((precise_unit *)auStack_228,12.0,&local_238,uVar2);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  pVar7 = units::precise_unit::inv((precise_unit *)auStack_228);
  com2inv.multiplier_ = pVar7._8_8_;
  auStack_228 = (undefined1  [8])pVar7.multiplier_;
  ppVar6 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_
            ((string *)&gtest_ar_3.message_,(units *)auStack_228,ppVar6,(uint64_t)ppVar3);
  std::__cxx11::string::operator=((string *)&gtest_ar.message_,(string *)&gtest_ar_3.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
  std::__cxx11::string::string((string *)&local_2e0,(string *)&gtest_ar.message_);
  uVar4 = units::getDefaultFlags();
  pVar7 = units::unit_from_string(&local_2e0,uVar4);
  local_2c0._8_8_ = pVar7._8_8_;
  local_2c0.multiplier_ = pVar7.multiplier_;
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_2b0,"unit_from_string(str)","com2inv",&local_2c0,
             (precise_unit *)auStack_228);
  std::__cxx11::string::~string((string *)&local_2e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_commodities.cpp"
               ,0xb1,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(commodities, unusual2string)
{
    precise_unit com(1.0, precise::kg.inv(), getCommodity("happy'u"));
    auto str = to_string(com);
    EXPECT_EQ(unit_from_string(str), com);

    precise_unit com2(12.0, precise::kg.pow(-2), getCommodity("happy'u"));
    str = to_string(com2);
    EXPECT_EQ(unit_from_string(str), com2);

    precise_unit cominv = com.inv();
    str = to_string(cominv);
    EXPECT_EQ(unit_from_string(str), cominv);

    precise_unit com2inv(
        12.0, precise::m.pow(-2) * precise::kg, getCommodity("happy'u"));
    com2inv = com2inv.inv();
    str = to_string(com2inv);
    EXPECT_EQ(unit_from_string(str), com2inv);
}